

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O0

Regexp * re2::Regexp::RemoveLeadingRegexp(Regexp *re)

{
  RegexpOp RVar1;
  int iVar2;
  ParseFlags parse_flags;
  Regexp **__dest;
  ParseFlags pf;
  Regexp *nre;
  Regexp **sub;
  Regexp *re_local;
  
  RVar1 = op(re);
  re_local = re;
  if (RVar1 != kRegexpEmptyMatch) {
    RVar1 = op(re);
    if ((RVar1 == kRegexpConcat) && (iVar2 = nsub(re), 1 < iVar2)) {
      __dest = Regexp::sub(re);
      RVar1 = op(*__dest);
      if (RVar1 != kRegexpEmptyMatch) {
        Decref(*__dest);
        *__dest = (Regexp *)0x0;
        iVar2 = nsub(re);
        if (iVar2 == 2) {
          re_local = __dest[1];
          __dest[1] = (Regexp *)0x0;
          Decref(re);
        }
        else {
          re->nsub_ = re->nsub_ - 1;
          memmove(__dest,__dest + 1,(ulong)re->nsub_ << 3);
        }
      }
    }
    else {
      parse_flags = Regexp::parse_flags(re);
      Decref(re);
      re_local = (Regexp *)operator_new(0x28);
      Regexp(re_local,kRegexpEmptyMatch,parse_flags);
    }
  }
  return re_local;
}

Assistant:

Regexp* Regexp::RemoveLeadingRegexp(Regexp* re) {
  if (re->op() == kRegexpEmptyMatch)
    return re;
  if (re->op() == kRegexpConcat && re->nsub() >= 2) {
    Regexp** sub = re->sub();
    if (sub[0]->op() == kRegexpEmptyMatch)
      return re;
    sub[0]->Decref();
    sub[0] = NULL;
    if (re->nsub() == 2) {
      // Collapse concatenation to single regexp.
      Regexp* nre = sub[1];
      sub[1] = NULL;
      re->Decref();
      return nre;
    }
    // 3 or more -> 2 or more.
    re->nsub_--;
    memmove(sub, sub + 1, re->nsub_ * sizeof sub[0]);
    return re;
  }
  Regexp::ParseFlags pf = re->parse_flags();
  re->Decref();
  return new Regexp(kRegexpEmptyMatch, pf);
}